

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.h
# Opt level: O2

void __thiscall gui::MenuBarStyle::MenuBarStyle(MenuBarStyle *this,MenuBarStyle *param_1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Color CVar6;
  Color CVar7;
  Color CVar8;
  Color CVar9;
  
  (this->super_Style).gui_ = (param_1->super_Style).gui_;
  (this->super_Style)._vptr_Style = (_func_int **)&PTR__MenuBarStyle_001dc6f8;
  sf::RectangleShape::RectangleShape(&this->bar_,&param_1->bar_);
  sf::RectangleShape::RectangleShape(&this->menu_,&param_1->menu_);
  sf::RectangleShape::RectangleShape(&this->highlight_,&param_1->highlight_);
  sf::Text::Text(&this->text_,&param_1->text_);
  CVar6 = param_1->textColor_;
  CVar7 = param_1->disabledTextColor_;
  CVar8 = param_1->highlightColor_;
  CVar9 = param_1->disabledHighlightColor_;
  fVar4 = (param_1->barTextPadding_).x;
  fVar5 = (param_1->barTextPadding_).y;
  uVar1 = *(undefined8 *)&(param_1->barTextPadding_).z;
  fVar3 = (param_1->menuTextPadding_).y;
  uVar2 = *(undefined8 *)&(param_1->menuTextPadding_).z;
  (this->menuTextPadding_).x = (param_1->menuTextPadding_).x;
  (this->menuTextPadding_).y = fVar3;
  *(undefined8 *)&(this->menuTextPadding_).z = uVar2;
  (this->barTextPadding_).x = fVar4;
  (this->barTextPadding_).y = fVar5;
  *(undefined8 *)&(this->barTextPadding_).z = uVar1;
  this->textColor_ = CVar6;
  this->disabledTextColor_ = CVar7;
  this->highlightColor_ = CVar8;
  this->disabledHighlightColor_ = CVar9;
  return;
}

Assistant:

virtual ~MenuBarStyle() = default;